

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpointingdevice.cpp
# Opt level: O1

bool __thiscall
QPointingDevicePrivate::addPassiveGrabber
          (QPointingDevicePrivate *this,QPointerEvent *event,QEventPoint *point,QObject *grabber)

{
  QObject *pQVar1;
  void *pvVar2;
  int *piVar3;
  Stream *pSVar4;
  QExplicitlySharedDataPointer<QEventPointPrivate> this_00;
  int t;
  qsizetype qVar5;
  undefined8 uVar6;
  QDebug *pQVar7;
  long lVar8;
  QMovableArrayOps<QPointer<QObject>> *this_01;
  bool bVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  const_iterator cVar11;
  QDebug local_c0;
  Stream *local_b8;
  QDebug local_b0;
  QEventPoint local_a8;
  undefined1 local_a0 [8];
  Stream *local_98;
  QString local_90;
  QExplicitlySharedDataPointer<QEventPointPrivate> local_78;
  undefined4 local_6c;
  QPointer<QObject> local_68;
  undefined8 local_58;
  QExplicitlySharedDataPointer<QEventPointPrivate> *pQStack_50;
  QEventPoint *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QInputDevicePrivate).field_0x8;
  local_98 = (Stream *)grabber;
  local_68.wp.d._0_4_ = QEventPoint::id(point);
  cVar11 = QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
           ::find(&this->activePoints,(int *)&local_68);
  lVar8 = cVar11.i;
  if ((lVar8 == (this->activePoints).c.keys.super_QVLABase<int>.super_QVLABaseBase.s) ||
     (pvVar2 = (this->activePoints).c.values.super_QVLABase<QPointingDevicePrivate::EventPointData>.
               super_QVLABaseBase.ptr, pvVar2 == (void *)0x0)) {
    local_68.wp.d._0_4_ = 2;
    local_68.wp.d._4_4_ = 0;
    local_68.wp.value._0_4_ = 0;
    local_68.wp.value._4_4_ = 0;
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    pQStack_50 = (QExplicitlySharedDataPointer<QEventPointPrivate> *)0x6b110e;
    QMessageLogger::warning();
    this_00.d.ptr = local_78.d.ptr;
    QVar10.m_data = (storage_type *)0x1c;
    QVar10.m_size = (qsizetype)&local_90;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)this_00.d.ptr,&local_90);
    if ((Stream *)local_90.d.d != (Stream *)0x0) {
      LOCK();
      *(int *)local_90.d.d = *(int *)local_90.d.d + -1;
      UNLOCK();
      if (*(int *)local_90.d.d == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(char *)&((QPointF *)((long)local_78.d.ptr + 0x30))->xp == '\x01') {
      QTextStream::operator<<((QTextStream *)local_78.d.ptr,' ');
    }
    local_a8.d.d.ptr =
         (QExplicitlySharedDataPointer<QEventPointPrivate>)
         (QExplicitlySharedDataPointer<QEventPointPrivate>)local_78.d.ptr;
    *(int *)&(((QList<QEventPoint> *)((long)local_78.d.ptr + 0x28))->d).d =
         *(int *)&(((QList<QEventPoint> *)((long)local_78.d.ptr + 0x28))->d).d + 1;
    ::operator<<((Stream *)local_a0,&local_a8);
    QDebug::~QDebug((QDebug *)local_a0);
    QDebug::~QDebug((QDebug *)&local_a8);
    QDebug::~QDebug((QDebug *)&local_78);
    bVar9 = false;
  }
  else {
    this_01 = (QMovableArrayOps<QPointer<QObject>> *)((long)pvVar2 + lVar8 * 0x58 + 0x28);
    bVar9 = false;
    qVar5 = QtPrivate::indexOf<QPointer<QObject>,QObject*>
                      ((QList<QPointer<QObject>_> *)this_01,(QObject **)&local_98,0);
    if (qVar5 == -1) {
      QtPrivateLogging::lcPointerGrab();
      if (((byte)QtPrivateLogging::lcPointerGrab::category.field_2.bools.enabledDebug._q_value.
                 _M_base._M_i & 1) != 0) {
        QtPrivateLogging::lcPointerGrab();
        if (((byte)QtPrivateLogging::lcPointerGrab::category.field_2.bools.enabledDebug._q_value.
                   _M_base._M_i & 1) != 0) {
          local_68.wp.d._0_4_ = 2;
          local_68.wp.d._4_4_ = 0;
          local_68.wp.value._0_4_ = 0;
          local_68.wp.value._4_4_ = 0;
          local_58._0_4_ = 0;
          local_58._4_4_ = 0;
          pQStack_50 = (QExplicitlySharedDataPointer<QEventPointPrivate> *)
                       QtPrivateLogging::lcPointerGrab::category.name;
          QMessageLogger::debug();
          pQVar7 = QDebug::operator<<((QDebug *)&local_78,&(this->super_QInputDevicePrivate).name);
          pQVar7 = QDebug::operator<<(pQVar7,"point");
          t = QEventPoint::id(point);
          pQVar7 = QDebug::operator<<(pQVar7,t);
          local_c0.stream = pQVar7->stream;
          (local_c0.stream)->ref = (local_c0.stream)->ref + 1;
          QEventPoint::state(point);
          ::operator<<((Stream *)&local_90,(State)&local_c0);
          pQVar7 = QDebug::operator<<((QDebug *)&local_90,": grab (passive)");
          local_b8 = pQVar7->stream;
          local_b8->ref = local_b8->ref + 1;
          ::operator<<((QDebug *)&local_b0,(QObject *)&local_b8);
          QDebug::~QDebug(&local_b0);
          QDebug::~QDebug((QDebug *)&local_b8);
          QDebug::~QDebug((QDebug *)&local_90);
          QDebug::~QDebug(&local_c0);
          QDebug::~QDebug((QDebug *)&local_78);
        }
      }
      pSVar4 = local_98;
      if (local_98 == (Stream *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)local_98);
      }
      local_68.wp.d._0_4_ = (int)uVar6;
      local_68.wp.d._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
      local_68.wp.value._0_4_ = SUB84(pSVar4,0);
      local_68.wp.value._4_4_ = (undefined4)((ulong)pSVar4 >> 0x20);
      QtPrivate::QMovableArrayOps<QPointer<QObject>>::emplace<QPointer<QObject>>
                (this_01,*(qsizetype *)((long)pvVar2 + lVar8 * 0x58 + 0x38),&local_68);
      QList<QPointer<QObject>_>::end((QList<QPointer<QObject>_> *)this_01);
      piVar3 = (int *)CONCAT44(local_68.wp.d._4_4_,(int)local_68.wp.d);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if ((*piVar3 == 0) &&
           ((void *)CONCAT44(local_68.wp.d._4_4_,(int)local_68.wp.d) != (void *)0x0)) {
          operator_delete((void *)CONCAT44(local_68.wp.d._4_4_,(int)local_68.wp.d));
        }
      }
      local_68.wp.value = (QObject *)&local_90;
      local_90.d.d = (Data *)local_98;
      local_58 = &local_6c;
      local_6c = 1;
      pQStack_50 = &local_78;
      local_68.wp.d._0_4_ = 0;
      local_68.wp.d._4_4_ = 0;
      local_78.d.ptr =
           (totally_ordered_wrapper<QEventPointPrivate_*>)
           (totally_ordered_wrapper<QEventPointPrivate_*>)event;
      local_48 = point;
      QMetaObject::activate(pQVar1,&QPointingDevice::staticMetaObject,0,(void **)&local_68);
      bVar9 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool QPointingDevicePrivate::addPassiveGrabber(const QPointerEvent *event, const QEventPoint &point, QObject *grabber)
{
    Q_Q(QPointingDevice);
    auto persistentPoint = queryPointById(point.id());
    if (!persistentPoint) {
        qWarning() << "point is not in activePoints" << point;
        return false;
    }
    if (persistentPoint->passiveGrabbers.contains(grabber))
        return false;
    if (Q_UNLIKELY(lcPointerGrab().isDebugEnabled())) {
        qCDebug(lcPointerGrab) << name << "point" << point.id() << point.state()
                               << ": grab (passive)" << grabber;
    }
    persistentPoint->passiveGrabbers << grabber;
    emit q->grabChanged(grabber, QPointingDevice::GrabPassive, event, point);
    return true;
}